

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O1

list * list_create(void)

{
  list *plVar1;
  
  plVar1 = (list *)malloc(0x18);
  if (plVar1 != (list *)0x0) {
    plVar1->head = (node *)0x0;
    plVar1->tail = (node *)0x0;
    plVar1->size = 0;
    return plVar1;
  }
  return (list *)0x0;
}

Assistant:

struct list *list_create(void)
{
        struct list *list = malloc(sizeof(struct list));

        if (list == NULL) {
                return NULL;
        }

        list->head = NULL;
        list->tail = NULL;
        list->size = 0;

        return list;
}